

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_ends_with(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t __n;
  long in_RDX;
  vm_val_t *in_RDI;
  size_t len2;
  size_t len;
  char *str2;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if ((getp_ends_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_ends_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_ends_with::desc,1);
    __cxa_guard_release(&getp_ends_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,
                     (uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    pcVar2 = CVmBif::pop_str_val();
    sVar3 = vmb_get_len((char *)0x33ac4c);
    __n = vmb_get_len((char *)0x33ac5b);
    uVar4 = 0;
    if (__n <= sVar3) {
      iVar1 = memcmp((void *)((in_RDX + 2 + sVar3) - __n),pcVar2 + 2,__n);
      uVar4 = (uint)(iVar1 == 0) << 0x18;
    }
    vm_val_t::set_logical(in_RDI,uVar4 >> 0x18);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_ends_with(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    const char *str2;
    size_t len;
    size_t len2;

    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the other string */
    str2 = CVmBif::pop_str_val(vmg0_);

    /* get the lengths of the two strings */
    len = vmb_get_len(str);
    len2 = vmb_get_len(str2);

    /* move to the contents of each string */
    str += VMB_LEN;
    str2 += VMB_LEN;

    /* 
     *   If the other string is no longer than our string, and the other
     *   string matches our string at the end exactly for the other string's
     *   entire length, we start with the other string.  Note we don't need
     *   to worry about finding a valid character index in our string for
     *   the ending offset, because all we care about is whether or not we
     *   have an exact byte match between our suffix and the other string.  
     */
    retval->set_logical(len2 <= len
                        && memcmp(str + len - len2, str2, len2) == 0);

    /* handled */
    return TRUE;
}